

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

void hexdump(char *title,uint8_t *p,size_t l)

{
  byte *pbVar1;
  int iVar2;
  
  fprintf(_stderr,"%s (%zu bytes):\n",title,l);
  if (l != 0) {
    do {
      fputs("   ",_stderr);
      iVar2 = 0x10;
      pbVar1 = p;
      do {
        p = pbVar1 + 1;
        fprintf(_stderr," %02x",(ulong)*pbVar1);
        if (l == 1) {
          l = 0;
          break;
        }
        l = l - 1;
        iVar2 = iVar2 + -1;
        pbVar1 = p;
      } while (iVar2 != 0);
      fputc(10,_stderr);
    } while (l != 0);
  }
  return;
}

Assistant:

static void hexdump(const char *title, const uint8_t *p, size_t l)
{
    fprintf(stderr, "%s (%zu bytes):\n", title, l);

    while (l != 0) {
        int i;
        fputs("   ", stderr);
        for (i = 0; i < 16; ++i) {
            fprintf(stderr, " %02x", *p++);
            if (--l == 0)
                break;
        }
        fputc('\n', stderr);
    }
}